

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QCss::ImportRule>::copyAppend
          (QGenericArrayOps<QCss::ImportRule> *this,ImportRule *b,ImportRule *e)

{
  qsizetype *pqVar1;
  ImportRule *pIVar2;
  long lVar3;
  Data *pDVar4;
  Data *pDVar5;
  
  if ((b != e) && (b < e)) {
    pIVar2 = (this->super_QArrayDataPointer<QCss::ImportRule>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<QCss::ImportRule>).size;
      pDVar4 = (b->href).d.d;
      pIVar2[lVar3].href.d.d = pDVar4;
      pIVar2[lVar3].href.d.ptr = (b->href).d.ptr;
      pIVar2[lVar3].href.d.size = (b->href).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pDVar5 = (b->media).d.d;
      pIVar2[lVar3].media.d.d = pDVar5;
      pIVar2[lVar3].media.d.ptr = (b->media).d.ptr;
      pIVar2[lVar3].media.d.size = (b->media).d.size;
      if (pDVar5 != (Data *)0x0) {
        LOCK();
        (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<QCss::ImportRule>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }